

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConsiderExplicifyingAlgebraic<mp::LinearFunctionalConstraint>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,LinearFunctionalConstraint *con,int i)

{
  bool bVar1;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  ConInfo *this_01;
  FunctionalConstraint *in_RSI;
  long in_RDI;
  LinTerms *in_stack_00000020;
  ConInfo *ie;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
  *ck;
  int in_stack_000000c4;
  LinearFunctionalConstraint *in_stack_000000c8;
  Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_000000d0;
  int in_stack_ffffffffffffffac;
  FlatModel<mp::DefaultFlatModelParams> *in_stack_ffffffffffffffb0;
  
  FunctionalConstraint::GetResultVar(in_RSI);
  bVar1 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (bVar1) {
    bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::ModelAPIOk<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                      ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)0x1e7257);
    if (bVar1) {
      LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x1e7267);
      bVar1 = HasExpressionArgs((Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                 *)ie,in_stack_00000020);
      if (!bVar1) {
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::GetConstraintKeeper
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)(in_RDI + -0x208),(LinearFunctionalConstraint *)0x0);
        this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   *)(in_RDI + -0x208);
        FunctionalConstraint::GetResultVar(in_RSI);
        this_01 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::GetInitExpression(this_00,in_stack_ffffffffffffffac);
        ConstraintLocationHelper<mp::BasicConstraintKeeper>::GetIndex(this_01);
        ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
        ::ConvertConstraint((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
                             *)this_00,in_stack_ffffffffffffffac);
        return true;
      }
    }
    DoExplicify<mp::LinearFunctionalConstraint,_true>
              (in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
  }
  return false;
}

Assistant:

bool ConsiderExplicifyingAlgebraic(const AlgFuncCon& con, int i) {
    if (MPCD( IsProperVar(con.GetResultVar()) )) {
      using TargetCon = AlgebraicConstraint<
          std::decay_t<decltype(con.GetArguments().GetBody())>,
          AlgConRhs<0> >;  // @todo can be ,=, >=
      if (!MPCD( template ModelAPIOk< TargetCon >() )
          || HasExpressionArgs(con.GetArguments())) {
        DoExplicify(con, i);          // as other explicified expressions
        return false;
      }
      auto& ck = GET_CONSTRAINT_KEEPER(AlgFuncCon);
      const auto& ie = MPD( GetInitExpression(con.GetResultVar()) );
      ck.ConvertConstraint(ie.GetIndex());
      return true;
    }
    return false;
  }